

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_blockwise_nl_join.cpp
# Opt level: O1

void __thiscall
duckdb::PhysicalBlockwiseNLJoin::PhysicalBlockwiseNLJoin
          (PhysicalBlockwiseNLJoin *this,LogicalOperator *op,PhysicalOperator *left,
          PhysicalOperator *right,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *condition,
          JoinType join_type,idx_t estimated_cardinality)

{
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *this_00;
  pointer *pprVar1;
  iterator iVar2;
  reference_wrapper<duckdb::PhysicalOperator> local_28;
  
  PhysicalJoin::PhysicalJoin
            (&this->super_PhysicalJoin,op,BLOCKWISE_NL_JOIN,join_type,estimated_cardinality);
  (this->super_PhysicalJoin).super_CachingPhysicalOperator.super_PhysicalOperator.
  _vptr_PhysicalOperator = (_func_int **)&PTR__PhysicalBlockwiseNLJoin_0249d170;
  (this->condition).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
  _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
       (condition->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (condition->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  this_00 = &(this->super_PhysicalJoin).super_CachingPhysicalOperator.super_PhysicalOperator.
             children;
  iVar2._M_current =
       *(pointer *)
        ((long)&(this->super_PhysicalJoin).super_CachingPhysicalOperator.super_PhysicalOperator.
                children.
                super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                .
                super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                ._M_impl + 8);
  if (iVar2._M_current ==
      *(pointer *)
       ((long)&(this->super_PhysicalJoin).super_CachingPhysicalOperator.super_PhysicalOperator.
               children.
               super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               ._M_impl + 0x10)) {
    local_28._M_data = left;
    ::std::
    vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
    ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator>>
              ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                *)this_00,iVar2,&local_28);
  }
  else {
    (iVar2._M_current)->_M_data = left;
    pprVar1 = (pointer *)
              ((long)&(this->super_PhysicalJoin).super_CachingPhysicalOperator.
                      super_PhysicalOperator.children.
                      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                      .
                      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                      ._M_impl + 8);
    *pprVar1 = *pprVar1 + 1;
  }
  iVar2._M_current =
       *(pointer *)
        ((long)&(this->super_PhysicalJoin).super_CachingPhysicalOperator.super_PhysicalOperator.
                children.
                super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                .
                super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                ._M_impl + 8);
  if (iVar2._M_current ==
      *(pointer *)
       ((long)&(this->super_PhysicalJoin).super_CachingPhysicalOperator.super_PhysicalOperator.
               children.
               super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               ._M_impl + 0x10)) {
    local_28._M_data = right;
    ::std::
    vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
    ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator>>
              ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                *)this_00,iVar2,&local_28);
  }
  else {
    (iVar2._M_current)->_M_data = right;
    pprVar1 = (pointer *)
              ((long)&(this->super_PhysicalJoin).super_CachingPhysicalOperator.
                      super_PhysicalOperator.children.
                      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                      .
                      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                      ._M_impl + 8);
    *pprVar1 = *pprVar1 + 1;
  }
  return;
}

Assistant:

PhysicalBlockwiseNLJoin::PhysicalBlockwiseNLJoin(LogicalOperator &op, PhysicalOperator &left, PhysicalOperator &right,
                                                 unique_ptr<Expression> condition, JoinType join_type,
                                                 idx_t estimated_cardinality)
    : PhysicalJoin(op, PhysicalOperatorType::BLOCKWISE_NL_JOIN, join_type, estimated_cardinality),
      condition(std::move(condition)) {
	children.push_back(left);
	children.push_back(right);
	// MARK and SINGLE joins not handled
	D_ASSERT(join_type != JoinType::MARK);
	D_ASSERT(join_type != JoinType::SINGLE);
}